

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib650.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  curl_httppost *formpost;
  curl_httppost *lastptr;
  size_t formlength;
  char flbuf [32];
  curl_forms formarray [3];
  
  formpost = (curl_httppost *)0x0;
  lastptr = (curl_httppost *)0x0;
  formlength = 0;
  iVar1 = curl_global_init(3);
  if (iVar1 != 0) {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    return 0x7e;
  }
  lVar7 = 0;
  lVar3 = curl_slist_append(0,"X-customheader-1: Header 1 data");
  iVar1 = 0x7e;
  if (lVar3 == 0) {
    lVar3 = 0;
  }
  else {
    lVar4 = curl_slist_append(lVar3,"X-customheader-2: Header 2 data");
    if (lVar4 == 0) {
      lVar7 = 0;
    }
    else {
      lVar3 = curl_slist_append(lVar4,"Content-Type: text/plain");
      if (lVar3 == 0) {
        lVar7 = 0;
        lVar3 = lVar4;
      }
      else {
        iVar2 = curl_formadd(&formpost,&lastptr,1,"fieldname",4,data,0xf,lVar3,0x11);
        if (iVar2 == 0) {
          sVar5 = strlen(data);
          formarray[1].value = (char *)(sVar5 - 1);
          formarray[0].option = CURLFORM_PTRCONTENTS;
          formarray[0].value = data;
          formarray[1].option = CURLFORM_CONTENTSLENGTH;
          formarray[2].option = CURLFORM_END;
          formarray[2].value = (char *)0x0;
          iVar2 = curl_formadd(&formpost,&lastptr,2,"fieldname",3,8,8,formarray,0x10,
                               "remotefile.txt",0x11);
          if (iVar2 == 0) {
            data[0] = data[0] + '\x01';
            iVar2 = curl_formadd(&formpost,&lastptr,1,"multifile",10,libtest_arg2,10,libtest_arg2,
                                 0xe,"text/whatever",10,libtest_arg2,0x11);
            if (iVar2 == 0) {
              iVar2 = curl_formadd(&formpost,&lastptr,1,"filecontents",7,libtest_arg2,0x11);
              if (iVar2 == 0) {
                curl_formget(formpost,&formlength,count_chars);
                curl_msnprintf(flbuf,0x20,"%lu",formlength);
                iVar2 = curl_formadd(&formpost,&lastptr,1,"formlength",4,flbuf,0x11);
                if (iVar2 == 0) {
                  iVar2 = curl_formadd(&formpost,&lastptr,1,"standardinput",10,"-",0x11);
                  if (iVar2 == 0) {
                    lVar7 = curl_easy_init();
                    if (lVar7 == 0) {
                      lVar7 = 0;
                      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
                    }
                    else {
                      iVar1 = curl_easy_setopt(lVar7,0x2712,URL);
                      if ((((iVar1 == 0) &&
                           (iVar1 = curl_easy_setopt(lVar7,0x2728,formpost), iVar1 == 0)) &&
                          (iVar1 = curl_easy_setopt(lVar7,0x29,1), iVar1 == 0)) &&
                         (iVar1 = curl_easy_setopt(lVar7,0x2a,1), iVar1 == 0)) {
                        iVar1 = curl_easy_perform(lVar7);
                      }
                    }
                    goto LAB_0010153e;
                  }
                  pcVar6 = "curl_formadd(6) = %d\n";
                }
                else {
                  pcVar6 = "curl_formadd(5) = %d\n";
                }
              }
              else {
                pcVar6 = "curl_formadd(4) = %d\n";
              }
            }
            else {
              pcVar6 = "curl_formadd(3) = %d\n";
            }
          }
          else {
            pcVar6 = "curl_formadd(2) = %d\n";
          }
        }
        else {
          pcVar6 = "curl_formadd(1) = %d\n";
        }
        lVar7 = 0;
        curl_mprintf(pcVar6,iVar2);
      }
    }
  }
LAB_0010153e:
  curl_easy_cleanup(lVar7);
  curl_formfree(formpost);
  curl_slist_free_all(lVar3);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *curl = NULL;
  CURLcode res = TEST_ERR_MAJOR_BAD;
  CURLFORMcode formrc;
  struct curl_slist *headers, *headers2 = NULL;
  struct curl_httppost *formpost = NULL;
  struct curl_httppost *lastptr = NULL;
  struct curl_forms formarray[3];
  size_t formlength = 0;
  char flbuf[32];
  long contentlength = 0;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  /* Check proper name and data copying, as well as headers. */
  headers = curl_slist_append(NULL, "X-customheader-1: Header 1 data");
  if(!headers) {
    goto test_cleanup;
  }
  headers2 = curl_slist_append(headers, "X-customheader-2: Header 2 data");
  if(!headers2) {
    goto test_cleanup;
  }
  headers = headers2;
  headers2 = curl_slist_append(headers, "Content-Type: text/plain");
  if(!headers2) {
    goto test_cleanup;
  }
  headers = headers2;
  formrc = curl_formadd(&formpost, &lastptr,
                        CURLFORM_COPYNAME, &name,
                        CURLFORM_COPYCONTENTS, &data,
                        CURLFORM_CONTENTHEADER, headers,
                        CURLFORM_END);

  if(formrc) {
    printf("curl_formadd(1) = %d\n", (int) formrc);
    goto test_cleanup;
  }

  contentlength = (long)(strlen(data) - 1);

  /* Use a form array for the non-copy test. */
  formarray[0].option = CURLFORM_PTRCONTENTS;
  formarray[0].value = data;
  formarray[1].option = CURLFORM_CONTENTSLENGTH;
  formarray[1].value = (char *)(size_t)contentlength;
  formarray[2].option = CURLFORM_END;
  formarray[2].value = NULL;
  formrc = curl_formadd(&formpost,
                        &lastptr,
                        CURLFORM_PTRNAME, name,
                        CURLFORM_NAMELENGTH, strlen(name) - 1,
                        CURLFORM_ARRAY, formarray,
                        CURLFORM_FILENAME, "remotefile.txt",
                        CURLFORM_END);

  if(formrc) {
    printf("curl_formadd(2) = %d\n", (int) formrc);
    goto test_cleanup;
  }

  /* Now change in-memory data to affect CURLOPT_PTRCONTENTS value.
     Copied values (first field) must not be affected.
     CURLOPT_PTRNAME actually copies the name thus we do not test this here. */
  data[0]++;

  /* Check multi-files and content type propagation. */
  formrc = curl_formadd(&formpost,
                        &lastptr,
                        CURLFORM_COPYNAME, "multifile",
                        CURLFORM_FILE, libtest_arg2,    /* Set in first.c. */
                        CURLFORM_FILE, libtest_arg2,
                        CURLFORM_CONTENTTYPE, "text/whatever",
                        CURLFORM_FILE, libtest_arg2,
                        CURLFORM_END);

  if(formrc) {
    printf("curl_formadd(3) = %d\n", (int) formrc);
    goto test_cleanup;
  }

  /* Check data from file content. */
  formrc = curl_formadd(&formpost,
                        &lastptr,
                        CURLFORM_COPYNAME, "filecontents",
                        CURLFORM_FILECONTENT, libtest_arg2,
                        CURLFORM_END);

  if(formrc) {
    printf("curl_formadd(4) = %d\n", (int) formrc);
    goto test_cleanup;
  }

  /* Measure the current form length.
   * This is done before including stdin data because we want to reuse it
   * and stdin cannot be rewound.
   */
  curl_formget(formpost, (void *) &formlength, count_chars);

  /* Include length in data for external check. */
  curl_msnprintf(flbuf, sizeof(flbuf), "%lu", (unsigned long) formlength);
  formrc = curl_formadd(&formpost,
                        &lastptr,
                        CURLFORM_COPYNAME, "formlength",
                        CURLFORM_COPYCONTENTS, &flbuf,
                        CURLFORM_END);
  if(formrc) {
    printf("curl_formadd(5) = %d\n", (int) formrc);
    goto test_cleanup;
  }

  /* Check stdin (may be problematic on some platforms). */
  formrc = curl_formadd(&formpost,
                        &lastptr,
                        CURLFORM_COPYNAME, "standardinput",
                        CURLFORM_FILE, "-",
                        CURLFORM_END);
  if(formrc) {
    printf("curl_formadd(6) = %d\n", (int) formrc);
    goto test_cleanup;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    goto test_cleanup;
  }

  /* First set the URL that is about to receive our POST. */
  test_setopt(curl, CURLOPT_URL, URL);

  /* send a multi-part formpost */
  test_setopt(curl, CURLOPT_HTTPPOST, formpost);

  /* get verbose debug output please */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* include headers in the output */
  test_setopt(curl, CURLOPT_HEADER, 1L);

  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);

  /* now cleanup the formpost chain */
  curl_formfree(formpost);
  curl_slist_free_all(headers);

  curl_global_cleanup();

  return res;
}